

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

void __thiscall
icu_63::NFRule::stripPrefix
          (NFRule *this,UnicodeString *text,UnicodeString *prefix,ParsePosition *pp)

{
  short sVar1;
  uint in_EAX;
  int iVar2;
  int32_t iVar3;
  UErrorCode status;
  undefined8 uStack_18;
  
  sVar1 = (prefix->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (prefix->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  if (iVar2 != 0) {
    uStack_18 = (ulong)in_EAX;
    iVar3 = prefixLength(this,text,prefix,(UErrorCode *)((long)&uStack_18 + 4));
    if ((iVar3 != 0) && (uStack_18._4_4_ < 1)) {
      pp->index = pp->index + iVar3;
      UnicodeString::remove(text,(char *)0x0);
    }
  }
  return;
}

Assistant:

void
NFRule::stripPrefix(UnicodeString& text, const UnicodeString& prefix, ParsePosition& pp) const
{
    // if the prefix text is empty, dump out without doing anything
    if (prefix.length() != 0) {
    	UErrorCode status = U_ZERO_ERROR;
        // use prefixLength() to match the beginning of
        // "text" against "prefix".  This function returns the
        // number of characters from "text" that matched (or 0 if
        // we didn't match the whole prefix)
        int32_t pfl = prefixLength(text, prefix, status);
        if (U_FAILURE(status)) { // Memory allocation error.
        	return;
        }
        if (pfl != 0) {
            // if we got a successful match, update the parse position
            // and strip the prefix off of "text"
            pp.setIndex(pp.getIndex() + pfl);
            text.remove(0, pfl);
        }
    }
}